

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfLut * ImfNewRound12logLut(int channels)

{
  ImfLut *pIVar1;
  RgbaChannels in_EDI;
  RgbaLut *unaff_retaddr;
  exception *e;
  _func_half_half *in_stack_fffffffffffffff8;
  
  pIVar1 = (ImfLut *)operator_new(0x10);
  Imf_3_4::RgbaLut::RgbaLut<Imath_3_2::half(*)(Imath_3_2::half)>
            (unaff_retaddr,in_stack_fffffffffffffff8,in_EDI);
  return pIVar1;
}

Assistant:

ImfLut*
ImfNewRound12logLut (int channels)
{
    try
    {
        return (ImfLut*) new OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaLut (
            OPENEXR_IMF_INTERNAL_NAMESPACE::round12log,
            OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}